

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,AtomicCounterIndexingCaseInstance *this)

{
  deUint32 *pdVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  pointer piVar5;
  TestLog *pTVar6;
  undefined8 uVar7;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  data;
  VkDescriptorSetLayoutBinding *pVVar8;
  DeviceInterface *vk;
  VkDevice device;
  pointer piVar9;
  InternalError *this_00;
  int *piVar10;
  int opNdx;
  long lVar11;
  pointer ppvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int counterNdx;
  long lVar16;
  reference rVar17;
  Buffer *in_stack_fffffffffffffc68;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  VkDescriptorBufferInfo bufferInfo;
  VkDescriptorPoolSize poolSizes [2];
  VkDeviceSize local_328;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  counterMasks;
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  vector<void_*,_std::allocator<void_*>_> outputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  Buffer atomicOpBuffer;
  VkDescriptorSetLayoutBinding bindings [2];
  
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&outValues,0x80,(allocator_type *)bindings);
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                              m_context);
  piVar10 = (int *)0x10;
  anon_unknown_0::Buffer::Buffer
            (&atomicOpBuffer,
             (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,0x20,0x10);
  indexBuffer.
  super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  .m_data.ptr = (Buffer *)0x0;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal
       = 0;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  OpaqueTypeIndexingTestInstance::checkSupported
            (&this->super_OpaqueTypeIndexingTestInstance,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
  puVar4 = (undefined8 *)
           (atomicOpBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  *puVar4 = 0;
  puVar4[1] = 0;
  anon_unknown_0::Buffer::flush(&atomicOpBuffer);
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    createUniformIndexBuffer
              ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)bindings,(this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context
               ,(int)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,piVar10);
    bindings[0].binding = 0;
    bindings[0].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    data._8_8_ = __return_storage_ptr__;
    data.ptr = in_stack_fffffffffffffc68;
    de::details::
    MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::operator=(&indexBuffer,data);
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             *)bindings);
  }
  bindings[1].descriptorCount = 1;
  bindings[1].stageFlags = 0x7fffffff;
  bindings[1].pImmutableSamplers = (VkSampler *)0x0;
  bindings[0].pImmutableSamplers = (VkSampler *)0x0;
  bindings[1].binding = 1;
  bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  layoutInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  layoutInfo.pNext = (void *)0x0;
  bindings[0].binding = 0;
  bindings[0].descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  bindings[0].descriptorCount = 1;
  bindings[0].stageFlags = 0x7fffffff;
  layoutInfo.flags = 0;
  layoutInfo.bindingCount = 2;
  layoutInfo.pBindings = bindings;
  ::vk::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)poolSizes,vk,device,&layoutInfo,
             (VkAllocationCallbacks *)0x0);
  bufferInfo.range = local_328;
  bufferInfo.buffer.m_internal._0_4_ = poolSizes[0].type;
  bufferInfo.buffer.m_internal._4_4_ = poolSizes[0].descriptorCount;
  bufferInfo.offset._0_4_ = poolSizes[1].type;
  bufferInfo.offset._4_4_ = poolSizes[1].descriptorCount;
  poolSizes[0].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes[0].descriptorCount = 0;
  poolSizes[1].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes[1].descriptorCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)bufferInfo.range;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
       bufferInfo.buffer.m_internal;
  extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferInfo.offset;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)poolSizes);
  poolSizes[0].type = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  poolSizes[0].descriptorCount = 1;
  poolSizes[1].type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  poolSizes[1].descriptorCount = 1;
  bindings[0].binding = 0x21;
  bindings[0].descriptorCount = 0;
  bindings[0].stageFlags = 0;
  bindings[0].pImmutableSamplers = (VkSampler *)0x100000001;
  bindings[1].binding = 2;
  bindings[1]._8_8_ = poolSizes;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&layoutInfo,vk,device,
             (VkDescriptorPoolCreateInfo *)bindings,(VkAllocationCallbacks *)0x0);
  pVVar8 = layoutInfo.pBindings;
  bufferInfo.range._0_4_ = layoutInfo.flags;
  bufferInfo.range._4_4_ = layoutInfo.bindingCount;
  bufferInfo.buffer.m_internal = layoutInfo._0_8_;
  bufferInfo.offset = (VkDeviceSize)layoutInfo.pNext;
  layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  layoutInfo._4_4_ = 0;
  layoutInfo.pNext = (void *)0x0;
  layoutInfo.flags = 0;
  layoutInfo.bindingCount = 0;
  layoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)bufferInfo.range;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar8;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       bufferInfo.buffer.m_internal;
  extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)bufferInfo.offset;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&layoutInfo);
  bindings[0].binding = 0x22;
  bindings[0].descriptorCount = 0;
  bindings[0].stageFlags = 0;
  bindings[0].pImmutableSamplers =
       (VkSampler *)
       extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
  ;
  bindings[1].binding = 1;
  bindings[1]._8_8_ = &extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&layoutInfo,vk,device,
             (VkDescriptorSetAllocateInfo *)bindings);
  pVVar8 = layoutInfo.pBindings;
  bufferInfo.range._0_4_ = layoutInfo.flags;
  bufferInfo.range._4_4_ = layoutInfo.bindingCount;
  bufferInfo.buffer.m_internal = layoutInfo._0_8_;
  bufferInfo.offset = (VkDeviceSize)layoutInfo.pNext;
  layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  layoutInfo._4_4_ = 0;
  layoutInfo.pNext = (void *)0x0;
  layoutInfo.flags = 0;
  layoutInfo.bindingCount = 0;
  layoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)bufferInfo.range;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal
       = (deUint64)pVVar8;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       bufferInfo.buffer.m_internal;
  extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferInfo.offset;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&layoutInfo);
  bufferInfo.buffer.m_internal =
       atomicOpBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  bufferInfo.offset = 0;
  bufferInfo.range = 0xffffffffffffffff;
  bindings[0].binding = 0x23;
  bindings[0].descriptorCount = 0;
  bindings[0].stageFlags = 0;
  bindings[0].pImmutableSamplers =
       (VkSampler *)
       extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  bindings[1].binding = 0;
  bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  bindings[1].descriptorCount = 1;
  bindings[1].stageFlags = 7;
  bindings[1].pImmutableSamplers = (VkSampler *)0x0;
  (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,bindings,0,0);
  if (indexBuffer.
      super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      .m_data.ptr != (Buffer *)0x0) {
    bufferInfo.buffer.m_internal =
         ((indexBuffer.
           super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
           .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
         m_internal;
    bufferInfo.offset = 0;
    bufferInfo.range = 0xffffffffffffffff;
    bindings[0].binding = 0x23;
    bindings[0].descriptorCount = 0;
    bindings[0].stageFlags = 0;
    bindings[0].pImmutableSamplers =
         (VkSampler *)
         extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    bindings[1].binding = 1;
    bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    bindings[1].descriptorCount = 1;
    bindings[1].stageFlags = 6;
    bindings[1].pImmutableSamplers = (VkSampler *)0x0;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,bindings,0,0);
  }
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
      INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    std::vector<int,_std::allocator<int>_>::resize
              (&expandedIndices,
               ((long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start) * 8);
    piVar5 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      iVar2 = piVar5[lVar11];
      for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 4) {
        *(int *)((long)piVar9 + lVar14) = iVar2;
      }
      piVar9 = piVar9 + 0x20;
    }
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x80) {
      bindings[0]._0_8_ =
           (long)expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar11;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&inputs,(void **)bindings);
    }
  }
  for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x80) {
    bindings[0]._0_8_ =
         (long)outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&outputs,(void **)bindings);
  }
  bindings[0]._0_8_ =
       createExecutor((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                      (this->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                      (this->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                      (VkDescriptorSetLayout)
                      extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      object.m_internal);
  ppvVar12 = (pointer)0x0;
  if (inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    ppvVar12 = inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  (*((ShaderExecutor *)bindings[0]._0_8_)->_vptr_ShaderExecutor[2])
            (bindings[0]._0_8_,0x20,ppvVar12,
             outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal);
  de::details::
  UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniqueBase((UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                 *)bindings);
  pTVar6 = ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->m_testCtx->
           m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)bindings,"Pass",(allocator<char> *)&bufferInfo);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)bindings);
  std::__cxx11::string::~string((string *)bindings);
  bindings[0]._0_8_ = bindings[0]._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&layoutInfo,4,(value_type_conflict4 *)bindings,
             (allocator_type *)&bufferInfo);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)poolSizes,4,
             (allocator_type *)bindings);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&counterMasks,4,(allocator_type *)bindings);
  piVar5 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    piVar10 = (int *)(layoutInfo._0_8_ + (long)piVar5[lVar11] * 4);
    *piVar10 = *piVar10 + 1;
  }
  puVar4 = (undefined8 *)
           (atomicOpBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  ::vk::invalidateMappedMemoryRange
            (atomicOpBuffer.m_vkd,atomicOpBuffer.m_device,
             (VkDeviceMemory)
             ((atomicOpBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (atomicOpBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,0xffffffffffffffff);
  uVar7 = puVar4[1];
  *(undefined8 *)poolSizes[0] = *puVar4;
  *(undefined8 *)((long)poolSizes[0] + 8) = uVar7;
  pdVar1 = &bindings[0].descriptorCount;
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    if (*(int *)(layoutInfo._0_8_ + lVar11 * 4) << 5 != *(int *)((long)poolSizes[0] + lVar11 * 4)) {
      bindings[0]._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
      std::operator<<((ostream *)pdVar1,"ERROR: atomic counter ");
      std::ostream::operator<<(pdVar1,(int)lVar11);
      std::operator<<((ostream *)pdVar1," has value ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
      std::operator<<((ostream *)pdVar1,", expected ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)bindings,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
      if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufferInfo,"Invalid atomic counter value",
                   (allocator<char> *)&stack0xfffffffffffffc6f);
        tcu::TestStatus::fail((TestStatus *)bindings,(string *)&bufferInfo);
        tcu::TestStatus::operator=(__return_storage_ptr__,(TestStatus *)bindings);
        std::__cxx11::string::~string((string *)&bindings[0].descriptorCount);
        std::__cxx11::string::~string((string *)&bufferInfo);
      }
    }
  }
  lVar11 = 0;
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&((counterMasks.
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p + lVar11),
               (long)(*(int *)(layoutInfo._0_8_ + lVar14 * 4) << 5),false);
    lVar11 = lVar11 + 0x28;
  }
  pdVar1 = &bindings[0].descriptorCount;
  lVar14 = 0;
  lVar11 = 0;
  do {
    if (lVar11 == 0x20) {
      if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          bindings[0]._0_8_ =
               counterMasks.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p;
          bindings[0]._8_8_ = bindings[0]._8_8_ & 0xffffffff00000000;
          uVar13 = 0;
          while (((_Bit_type *)bindings[0]._0_8_ !=
                  counterMasks.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_p ||
                 ((uint)uVar13 !=
                  counterMasks.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_offset))) {
            if ((*(ulong *)bindings[0]._0_8_ >> (uVar13 & 0x3f) & 1) == 0) {
              this_00 = (InternalError *)__cxa_allocate_exception(0x38);
              tcu::InternalError::InternalError
                        (this_00,(char *)0x0,"*i",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktOpaqueTypeIndexingTests.cpp"
                         ,0x716);
              __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
            }
            std::_Bit_const_iterator::operator++((_Bit_const_iterator *)bindings,0);
            uVar13 = bindings[0]._8_8_ & 0xffffffff;
          }
        }
      }
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&counterMasks);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)poolSizes);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&layoutInfo);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                (&extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                (&extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                (&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset(&indexBuffer.
               super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             );
      anon_unknown_0::Buffer::~Buffer(&atomicOpBuffer);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&outputs.super__Vector_base<void_*,_std::allocator<void_*>_>);
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&inputs.super__Vector_base<void_*,_std::allocator<void_*>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&expandedIndices.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
    lVar16 = lVar14;
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      iVar2 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar15];
      uVar3 = *(uint *)((long)outValues.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar16);
      if (uVar3 < (*(int *)&counterMasks.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar2].
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  *(int *)&counterMasks.
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar2].
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                  counterMasks.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_offset) {
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (counterMasks.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar2,(ulong)uVar3);
        if ((*rVar17._M_p & rVar17._M_mask) != 0) goto LAB_0087c9be;
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (counterMasks.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar2,(ulong)uVar3);
        *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
      }
      else {
LAB_0087c9be:
        bindings[0]._0_8_ = pTVar6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
        std::operator<<((ostream *)pdVar1,"ERROR: at invocation ");
        std::ostream::operator<<(pdVar1,(int)lVar11);
        std::operator<<((ostream *)pdVar1,", op ");
        std::ostream::operator<<(pdVar1,(int)lVar15);
        std::operator<<((ostream *)pdVar1,": got invalid result value ");
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)bindings,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
        if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bufferInfo,"Invalid result value",
                     (allocator<char> *)&stack0xfffffffffffffc6f);
          tcu::TestStatus::fail((TestStatus *)bindings,(string *)&bufferInfo);
          tcu::TestStatus::operator=(__return_storage_ptr__,(TestStatus *)bindings);
          std::__cxx11::string::~string((string *)&bindings[0].descriptorCount);
          std::__cxx11::string::~string((string *)&bufferInfo);
        }
      }
      lVar16 = lVar16 + 0x80;
    }
    lVar11 = lVar11 + 1;
    lVar14 = lVar14 + 4;
  } while( true );
}

Assistant:

tcu::TestStatus AtomicCounterIndexingCaseInstance::iterate (void)
{
	// \todo [2015-12-02 elecro] Add vertexPipelineStoresAndAtomics feature check.
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numCounters			= NUM_COUNTERS;
	const int					numOps				= NUM_OPS;
	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	std::vector<deUint32>		outValues			(numInvocations*numOps);

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	Buffer						atomicOpBuffer		(m_context, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, sizeof(deUint32)*numCounters);
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);

	deMemset(atomicOpBuffer.getHostPtr(), 0, sizeof(deUint32)*numCounters);
	atomicOpBuffer.flush();

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numOps, &m_opIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,	VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ 1u,	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		const VkDescriptorBufferInfo	bufferInfo			=
		{
			atomicOpBuffer.getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			1u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_opIndices.size());

		for (int opNdx = 0; opNdx < numOps; opNdx++)
		{
			int* dst = &expandedIndices[numInvocations*opNdx];
			std::fill(dst, dst+numInvocations, m_opIndices[opNdx]);
		}

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			inputs.push_back(&expandedIndices[opNdx*numInvocations]);
	}

	for (int opNdx = 0; opNdx < numOps; opNdx++)
		outputs.push_back(&outValues[opNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	{
		tcu::TestLog&					log				= m_context.getTestContext().getLog();
		tcu::TestStatus					testResult		= tcu::TestStatus::pass("Pass");
		std::vector<int>				numHits			(numCounters, 0);	// Number of hits per counter.
		std::vector<deUint32>			counterValues	(numCounters);
		std::vector<std::vector<bool> >	counterMasks	(numCounters);

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			numHits[m_opIndices[opNdx]] += 1;

		// Read counter values
		{
			const void* mapPtr = atomicOpBuffer.getHostPtr();
			DE_ASSERT(mapPtr != DE_NULL);
			atomicOpBuffer.invalidate();
			std::copy((const deUint32*)mapPtr, (const deUint32*)mapPtr + numCounters, &counterValues[0]);
		}

		// Verify counter values
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const deUint32		refCount	= (deUint32)(numHits[counterNdx]*numInvocations);
			const deUint32		resCount	= counterValues[counterNdx];

			if (refCount != resCount)
			{
				log << tcu::TestLog::Message << "ERROR: atomic counter " << counterNdx << " has value " << resCount
					<< ", expected " << refCount
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid atomic counter value");
			}
		}

		// Allocate bitmasks - one bit per each valid result value
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const int	counterValue	= numHits[counterNdx]*numInvocations;
			counterMasks[counterNdx].resize(counterValue, false);
		}

		// Verify result values from shaders
		for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
		{
			for (int opNdx = 0; opNdx < numOps; opNdx++)
			{
				const int		counterNdx	= m_opIndices[opNdx];
				const deUint32	resValue	= outValues[opNdx*numInvocations + invocationNdx];
				const bool		rangeOk		= de::inBounds(resValue, 0u, (deUint32)counterMasks[counterNdx].size());
				const bool		notSeen		= rangeOk && !counterMasks[counterNdx][resValue];
				const bool		isOk		= rangeOk && notSeen;

				if (!isOk)
				{
					log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
						<< ", op " << opNdx << ": got invalid result value "
						<< resValue
						<< tcu::TestLog::EndMessage;

					if (testResult.getCode() == QP_TEST_RESULT_PASS)
						testResult = tcu::TestStatus::fail("Invalid result value");
				}
				else
				{
					// Mark as used - no other invocation should see this value from same counter.
					counterMasks[counterNdx][resValue] = true;
				}
			}
		}

		if (testResult.getCode() == QP_TEST_RESULT_PASS)
		{
			// Consistency check - all masks should be 1 now
			for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
			{
				for (std::vector<bool>::const_iterator i = counterMasks[counterNdx].begin(); i != counterMasks[counterNdx].end(); i++)
					TCU_CHECK_INTERNAL(*i);
			}
		}

		return testResult;
	}
}